

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

void FreeLevel(Level *lvl)

{
  Triangle *pTVar1;
  Edge *pEVar2;
  Material *pMVar3;
  ObjectType *pOVar4;
  Vertex *pVVar5;
  Object *pOVar6;
  Triangle *__ptr;
  Edge *__ptr_00;
  Material *__ptr_01;
  ObjectType *__ptr_02;
  Vertex *__ptr_03;
  Object *__ptr_04;
  
  if (lvl != (Level *)0x0) {
    FreeQuadTree(&lvl->DisplayTree);
    FreeQuadTree(&lvl->CollisionTree);
    __ptr = lvl->AllTris;
    while (__ptr != (Triangle *)0x0) {
      pTVar1 = __ptr->Next;
      free(__ptr);
      lvl->AllTris = pTVar1;
      __ptr = pTVar1;
    }
    __ptr_00 = lvl->AllEdges;
    while (__ptr_00 != (Edge *)0x0) {
      pEVar2 = __ptr_00->Next;
      free(__ptr_00);
      lvl->AllEdges = pEVar2;
      __ptr_00 = pEVar2;
    }
    __ptr_01 = lvl->AllMats;
    while (__ptr_01 != (Material *)0x0) {
      pMVar3 = __ptr_01->Next;
      free(__ptr_01);
      lvl->AllMats = pMVar3;
      __ptr_01 = pMVar3;
    }
    __ptr_02 = lvl->AllObjectTypes;
    while (__ptr_02 != (ObjectType *)0x0) {
      pOVar4 = __ptr_02->Next;
      free(__ptr_02);
      lvl->AllObjectTypes = pOVar4;
      __ptr_02 = pOVar4;
    }
    __ptr_03 = lvl->AllVerts;
    while (__ptr_03 != (Vertex *)0x0) {
      pVVar5 = __ptr_03->Next;
      free(__ptr_03);
      lvl->AllVerts = pVVar5;
      __ptr_03 = pVVar5;
    }
    __ptr_04 = lvl->AllObjects;
    while (__ptr_04 != (Object *)0x0) {
      pOVar6 = __ptr_04->Next;
      free(__ptr_04);
      lvl->AllObjects = pOVar6;
      __ptr_04 = pOVar6;
    }
    FreeState(lvl->InitialState);
    free(lvl);
    return;
  }
  return;
}

Assistant:

void FreeLevel(struct Level *lvl)
{
   void *Next;

   if (!lvl)
      return;

   /* easy things first */
   FreeQuadTree(&lvl->DisplayTree);
   FreeQuadTree(&lvl->CollisionTree);

   /* free the resource lists */
   FreeList(AllTris, Triangle, NoAction);
   FreeList(AllEdges, Edge, NoAction);

   FreeList(AllMats, Material, NoAction);
   FreeList(AllObjectTypes, ObjectType, NoAction);

   FreeList(AllVerts, Vertex, NoAction);
   FreeList(AllObjects, Object, NoAction);

   /* finally, free the level structure itself */
   FreeState(lvl->InitialState);
   free(lvl);
}